

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

opj_bool opj_event_msg(opj_common_ptr cinfo,int event_type,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char message [512];
  int str_length;
  va_list arg;
  opj_event_mgr_t *event_mgr;
  opj_msg_callback msg_handler;
  undefined4 local_318;
  undefined1 local_308 [24];
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  char local_258 [524];
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  code *local_28;
  char *local_20;
  int local_14;
  long *local_10;
  opj_bool local_4;
  
  if (in_AL != '\0') {
    local_2d8 = in_XMM0_Qa;
    local_2c8 = in_XMM1_Qa;
    local_2b8 = in_XMM2_Qa;
    local_2a8 = in_XMM3_Qa;
    local_298 = in_XMM4_Qa;
    local_288 = in_XMM5_Qa;
    local_278 = in_XMM6_Qa;
    local_268 = in_XMM7_Qa;
  }
  local_28 = (code *)0x0;
  local_30 = *in_RDI;
  if (local_30 == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == 1) {
      local_28 = *(code **)(local_30 + 8);
    }
    else if (in_ESI == 2) {
      local_28 = *(code **)(local_30 + 0x10);
    }
    else if (in_ESI == 4) {
      local_28 = *(code **)(local_30 + 0x18);
    }
    if (local_28 == (code *)0x0) {
      local_4 = 0;
    }
    else {
      if ((in_RDX != (char *)0x0) && (local_30 != 0)) {
        local_2f0 = in_RCX;
        local_2e8 = in_R8;
        local_2e0 = in_R9;
        local_20 = in_RDX;
        local_14 = in_ESI;
        local_10 = in_RDI;
        memset(local_258,0,0x200);
        local_38 = local_308;
        local_40 = &stack0x00000008;
        local_44 = 0x30;
        local_48 = 0x18;
        sVar1 = strlen(local_20);
        if (sVar1 < 0x201) {
          sVar1 = strlen(local_20);
          local_318 = (undefined4)sVar1;
        }
        else {
          local_318 = 0x200;
        }
        local_4c = local_318;
        vsprintf(local_258,local_20,&local_48);
        (*local_28)(local_258,local_10[1]);
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

opj_bool opj_event_msg(opj_common_ptr cinfo, int event_type, const char *fmt, ...) {
#define MSG_SIZE 512 /* 512 bytes should be more than enough for a short message */
	opj_msg_callback msg_handler = NULL;

	opj_event_mgr_t *event_mgr = cinfo->event_mgr;
	if(event_mgr != NULL) {
		switch(event_type) {
			case EVT_ERROR:
				msg_handler = event_mgr->error_handler;
				break;
			case EVT_WARNING:
				msg_handler = event_mgr->warning_handler;
				break;
			case EVT_INFO:
				msg_handler = event_mgr->info_handler;
				break;
			default:
				break;
		}
		if(msg_handler == NULL) {
			return OPJ_FALSE;
		}
	} else {
		return OPJ_FALSE;
	}

	if ((fmt != NULL) && (event_mgr != NULL)) {
		va_list arg;
		int str_length/*, i, j*/; /* UniPG */
		char message[MSG_SIZE];
		memset(message, 0, MSG_SIZE);
		/* initialize the optional parameter list */
		va_start(arg, fmt);
		/* check the length of the format string */
		str_length = (strlen(fmt) > MSG_SIZE) ? MSG_SIZE : strlen(fmt);
		/* parse the format string and put the result in 'message' */
		vsprintf(message, fmt, arg); /* UniPG */
		/* deinitialize the optional parameter list */
		va_end(arg);

		/* output the message to the user program */
		msg_handler(message, cinfo->client_data);
	}

	return OPJ_TRUE;
}